

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_modifiers_test.h
# Opt level: O2

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertRange<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>
::InsertRange(InsertRange<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>
              *this)

{
  ModifiersTest<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>
  ::ModifiersTest(&this->
                   super_ModifiersTest<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>
                 );
  (this->
  super_ModifiersTest<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__Test_00237d38;
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertRange) {
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  m.insert(values.begin(), values.end());
  ASSERT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
}